

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
::SymbolicAddKel(TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                 *this,TPZVec<long> *destinationindex)

{
  int64_t maxeq;
  int64_t mineq;
  long local_38;
  int64_t local_30;
  
  TPZFrontNonSym<std::complex<double>_>::SymbolicAddKel(&this->fFront,destinationindex);
  EquationsToDecompose(this,destinationindex,&local_30,&local_38);
  if (local_30 <= local_38) {
    TPZFrontNonSym<std::complex<double>_>::SymbolicDecomposeEquations
              (&this->fFront,local_30,local_38);
    CheckCompress(this);
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	fFront.SymbolicAddKel(destinationindex);
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	
	if(maxeq >= mineq) {
		fFront.SymbolicDecomposeEquations(mineq,maxeq);
		CheckCompress();
	}
	
}